

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetNavIDWithRectRel(ImGuiID id,int nav_layer,ImRect *rect_rel)

{
  ImVec2 *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  
  pIVar3 = GImGui;
  SetNavID(id,nav_layer);
  IVar2 = rect_rel->Max;
  pIVar1 = &pIVar3->NavWindow->NavRectRel[nav_layer].Min;
  *pIVar1 = rect_rel->Min;
  pIVar1[1] = IVar2;
  pIVar3->NavMousePosDirty = true;
  pIVar3->NavDisableHighlight = false;
  pIVar3->NavDisableMouseHover = true;
  return;
}

Assistant:

void ImGui::SetNavIDWithRectRel(ImGuiID id, int nav_layer, const ImRect& rect_rel)
{
    ImGuiContext& g = *GImGui;
    SetNavID(id, nav_layer);
    g.NavWindow->NavRectRel[nav_layer] = rect_rel;
    g.NavMousePosDirty = true;
    g.NavDisableHighlight = false;
    g.NavDisableMouseHover = true;
}